

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O3

string * __thiscall
soul::ResolutionPass::FunctionResolver::findPossibleMisspeltFunction
          (string *__return_storage_ptr__,FunctionResolver *this,string *name)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ModuleBase *pMVar2;
  int iVar3;
  undefined4 extraout_var;
  Scope *scope;
  string nearest;
  size_t lowestDistance;
  string local_a8;
  size_t local_88;
  string local_80;
  string local_60;
  string local_40;
  undefined4 extraout_var_00;
  
  paVar1 = &local_a8.field_2;
  local_a8._M_string_length = 0;
  local_a8.field_2._M_local_buf[0] = '\0';
  local_88 = 5;
  pMVar2 = (this->super_ErrorIgnoringRewritingASTVisitor).module;
  scope = &pMVar2->super_Scope;
  local_a8._M_dataplus._M_p = (pointer)paVar1;
  if (pMVar2 == (ModuleBase *)0x0) {
    scope = (Scope *)0x0;
  }
  while( true ) {
    iVar3 = (*scope->_vptr_Scope[4])(scope);
    if (CONCAT44(extraout_var,iVar3) == 0) break;
    iVar3 = (*scope->_vptr_Scope[4])(scope);
    scope = (Scope *)CONCAT44(extraout_var_00,iVar3);
  }
  findLeastMisspeltFunction(scope,name,&local_a8,&local_88);
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,local_a8._M_dataplus._M_p,
             local_a8._M_dataplus._M_p + local_a8._M_string_length);
  Program::stripRootNamespaceFromQualifiedPath(&local_40,&local_60);
  std::__cxx11::string::operator=((string *)&local_a8,(string *)&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"soul::intrinsics","");
  TokenisedPathString::removeTopLevelNameIfPresent(__return_storage_ptr__,&local_a8,&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8._M_dataplus._M_p,
                    CONCAT71(local_a8.field_2._M_allocated_capacity._1_7_,
                             local_a8.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string findPossibleMisspeltFunction (const std::string& name)
        {
            std::string nearest;
            size_t lowestDistance = 5;

            AST::Scope* topLevelScope = std::addressof (module);

            while (topLevelScope->getParentScope() != nullptr)
                topLevelScope = topLevelScope->getParentScope();

            findLeastMisspeltFunction (*topLevelScope, name, nearest, lowestDistance);

            nearest = Program::stripRootNamespaceFromQualifiedPath (nearest);
            return TokenisedPathString::removeTopLevelNameIfPresent (nearest, getIntrinsicsNamespaceName());
        }